

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O2

string * __thiscall BaseUser::getFullName_abi_cxx11_(string *__return_storage_ptr__,BaseUser *this)

{
  allocator local_7a;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,&(this->super_Model<BaseUser>).field_0xc,&local_79);
  std::operator+(&local_58,&local_38," ");
  std::__cxx11::string::string((string *)&local_78,this->lastName,&local_7a);
  std::operator+(__return_storage_ptr__,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string BaseUser::getFullName() const {
    return string(firstName) + " " + string(lastName);
}